

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O3

int la_adsc_reporting_interval_parse(void *dest,uint8_t *buf,uint32_t len)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  la_adsc_tag_t *t;
  
  if (len != 0) {
    pbVar1 = (byte *)la_xcalloc(1,2,
                                "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/adsc.c"
                                ,0x60c,"la_adsc_reporting_interval_parse");
    *(byte **)((long)dest + 0x10) = pbVar1;
    bVar2 = *buf >> 6;
    bVar4 = 0x40;
    if (bVar2 != 3) {
      bVar4 = bVar2;
    }
    bVar3 = 8;
    if (bVar2 != 2) {
      bVar3 = bVar4;
    }
    *pbVar1 = bVar3;
    pbVar1[1] = *buf & 0x3f;
    return 1;
  }
  return -1;
}

Assistant:

LA_ADSC_PARSER_FUN(la_adsc_reporting_interval_parse) {
	uint32_t tag_len = 1;
	la_adsc_tag_t *t = dest;
	LA_ADSC_CHECK_LEN(t->tag, len, tag_len);
	LA_NEW(la_adsc_report_interval_req_t, ri);
	t->data = ri;
	uint8_t sf = (buf[0] & 0xc0) >> 6;
	// convert scaling factor to multiplier value
	if(sf == 2)
		sf = 8;
	else if(sf == 3)
		sf = 64;
	ri->scaling_factor = sf;
	ri->rate = buf[0] & 0x3f;
	la_debug_print(D_INFO, "SF=%u rate=%u\n", ri->scaling_factor, ri->rate);
	return tag_len;
}